

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HomeChecker.cpp
# Opt level: O0

bool __thiscall
tiger::trains::ai::HomeChecker::needHome
          (HomeChecker *this,Train *train,int len,int homeLen,GoodType type)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  Town *this_00;
  int in_ECX;
  int in_EDX;
  Train *in_RSI;
  value_type *in_RDI;
  int in_R8D;
  double dVar5;
  int curProduct_1;
  int maxLen_1;
  int predict_1;
  int curProduct;
  int maxLen;
  int predict;
  Town *homeTown;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  set<const_tiger::trains::world::Train_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<const_tiger::trains::world::Train_*>_>
  *in_stack_ffffffffffffff70;
  bool local_1;
  
  iVar1 = trains::world::Train::getGoods(in_RSI);
  if (iVar1 == 0) {
    local_1 = false;
  }
  else {
    sVar4 = std::
            set<const_tiger::trains::world::Train_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<const_tiger::trains::world::Train_*>_>
            ::count((set<const_tiger::trains::world::Train_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<const_tiger::trains::world::Train_*>_>
                     *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    (key_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (sVar4 == 0) {
      trains::world::Train::getPlayer(in_RSI);
      this_00 = (Town *)trains::world::Player::getHome((Player *)0x247ad7);
      if (in_R8D == 2) {
        iVar1 = trains::world::Town::getProduct(this_00);
        dVar5 = ceil((double)in_RDI[7] * (double)in_EDX);
        iVar1 = iVar1 - (int)dVar5;
        iVar2 = trains::world::Town::getPopulation(this_00);
        iVar3 = trains::world::Train::getGoods(in_RSI);
        if (iVar1 / iVar2 < in_EDX) {
          std::
          set<const_tiger::trains::world::Train_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<const_tiger::trains::world::Train_*>_>
          ::insert(in_stack_ffffffffffffff70,in_RDI);
          local_1 = true;
        }
        else {
          iVar1 = trains::world::Town::predictProduct(this_00,in_ECX);
          dVar5 = ceil((double)in_RDI[7] * (double)in_EDX);
          iVar3 = iVar3 + (iVar1 - (int)dVar5);
          iVar1 = trains::world::Town::getProductCapacity(this_00);
          if (iVar1 < iVar3) {
            std::
            set<const_tiger::trains::world::Train_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<const_tiger::trains::world::Train_*>_>
            ::insert(in_stack_ffffffffffffff70,in_RDI);
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
      }
      else {
        iVar1 = trains::world::Town::getArrmor(this_00);
        dVar5 = ceil((double)in_RDI[8] * (double)in_EDX);
        iVar2 = trains::world::Train::getGoods(in_RSI);
        if (in_EDX < 0x97) {
          iVar3 = trains::world::Town::getArrmorCapacity(this_00);
          if (iVar3 < iVar2 + (iVar1 - (int)dVar5)) {
            std::
            set<const_tiger::trains::world::Train_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<const_tiger::trains::world::Train_*>_>
            ::insert(in_stack_ffffffffffffff70,in_RDI);
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          std::
          set<const_tiger::trains::world::Train_*,_std::less<const_tiger::trains::world::Train_*>,_std::allocator<const_tiger::trains::world::Train_*>_>
          ::insert(in_stack_ffffffffffffff70,in_RDI);
          local_1 = true;
        }
      }
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool HomeChecker::needHome(world::Train *train, int len, int homeLen, models::GoodType type)
{
    if (train->getGoods() == 0)
        return false;

    if (goingHomeTrain.count(train) != 0)
        return true;

    const world::Town *homeTown = (world::Town *)train->getPlayer()->getHome();

    if (type == models::GoodType::PRODUCT)
    {
        int predict = homeTown->getProduct() - (int)std::ceil(dec_product*len);
        int maxLen = predict / homeTown->getPopulation();
        int curProduct = train->getGoods();


        if (maxLen < len)
        {
            goingHomeTrain.insert(train);
            return true;
        }


        predict = homeTown->predictProduct(homeLen) -
                  (int)std::ceil(dec_product*len);

        if (curProduct + predict > homeTown->getProductCapacity())
        {
            goingHomeTrain.insert(train);
            return true;
        }

        return false;
    }
    else
    {
        int predict = homeTown->getArrmor() - (int)std::ceil(dec_armor*len);
        int maxLen = 150;
        int curProduct = train->getGoods();

        if (maxLen < len)
        {
            goingHomeTrain.insert(train);
            return true;
        }

        if (curProduct + predict > homeTown->getArrmorCapacity())
        {
            goingHomeTrain.insert(train);
            return true;
        }

        return false;
    }
}